

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_numerators.hpp
# Opt level: O0

void __thiscall random_numerators<short>::random_numerators(random_numerators<short> *this)

{
  int iVar1;
  time_t tVar2;
  uint32_t *puVar3;
  undefined8 *in_RDI;
  random_numerators<short> *unaff_retaddr;
  undefined8 *puVar4;
  uint32_t size;
  
  *(undefined4 *)(in_RDI + 1) = 0x80000;
  puVar4 = in_RDI;
  tVar2 = time((time_t *)0x0);
  size = (uint32_t)((ulong)puVar4 >> 0x20);
  srand((uint)tVar2);
  iVar1 = rand();
  *(int *)(in_RDI + 1) = (iVar1 % 3) * 0x400 + *(int *)(in_RDI + 1);
  puVar3 = allocate(unaff_retaddr,size);
  *in_RDI = puVar3;
  randomize_buffer(unaff_retaddr);
  return;
}

Assistant:

random_numerators() {
#if defined(__AVR__)
        // Using 1/8 of free RAM should be enough to fool the 
        // compiler optimizer and give enough test iterations on
        // AVR hardware
        _length = (freeRAM()/8)/sizeof(T);
#else
        _length = 1 << 19;
        // Make sure that the number of iterations is not
        // known at compile time to prevent the compiler
        // from magically calculating results at compile
        // time and hence falsifying the benchmark.        
        srand((unsigned)time(NULL));
        _length += (rand() % 3) * (1 << 10);
#endif 
        _pData = allocate(_length * sizeof(T));

        randomize_buffer();
    }